

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oonf_stream_socket.c
# Opt level: O3

void oonf_stream_remove_managed(oonf_stream_managed *managed,_Bool force)

{
  os_interface_linux_remove(&managed->_if_listener);
  oonf_stream_remove(&managed->socket_v4,force);
  oonf_stream_remove(&managed->socket_v6,force);
  os_interface_linux_remove(&managed->_if_listener);
  netaddr_acl_remove(&managed->_managed_config);
  netaddr_acl_remove(&(managed->_managed_config).bindto);
  return;
}

Assistant:

void
oonf_stream_remove_managed(struct oonf_stream_managed *managed, bool force) {
  os_interface_remove(&managed->_if_listener);

  oonf_stream_remove(&managed->socket_v4, force);
  oonf_stream_remove(&managed->socket_v6, force);
  os_interface_remove(&managed->_if_listener);
  oonf_stream_free_managed_config(&managed->_managed_config);
}